

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ParameterValueAssignmentSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ParameterValueAssignmentSyntax,slang::parsing::Token&,slang::parsing::Token,std::span<slang::syntax::TokenOrSyntax,18446744073709551615ul>,slang::parsing::Token>
          (BumpAllocator *this,Token *args,Token *args_1,
          span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *args_2,Token *args_3)

{
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> elements;
  Token closeParen;
  ParameterValueAssignmentSyntax *pPVar1;
  long in_RDX;
  undefined8 *in_RSI;
  SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax> *in_stack_ffffffffffffff50;
  size_t in_stack_ffffffffffffff58;
  __extent_storage<18446744073709551615UL> in_stack_ffffffffffffff60;
  BumpAllocator *in_stack_ffffffffffffff68;
  SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax> *in_stack_ffffffffffffff88;
  ParameterValueAssignmentSyntax *in_stack_ffffffffffffff90;
  Token in_stack_ffffffffffffff98;
  Token in_stack_ffffffffffffffa8;
  undefined8 uVar2;
  Info *pIVar3;
  
  pPVar1 = (ParameterValueAssignmentSyntax *)
           allocate(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60._M_extent_value,
                    in_stack_ffffffffffffff58);
  pIVar3 = (Info *)*in_RSI;
  uVar2 = *(undefined8 *)(in_RDX + 8);
  elements._M_extent._M_extent_value = in_stack_ffffffffffffff60._M_extent_value;
  elements._M_ptr = (pointer)pPVar1;
  slang::syntax::SeparatedSyntaxList<slang::syntax::ParamAssignmentSyntax>::SeparatedSyntaxList
            (in_stack_ffffffffffffff50,elements);
  closeParen.info = pIVar3;
  closeParen.kind = (short)uVar2;
  closeParen._2_1_ = (char)((ulong)uVar2 >> 0x10);
  closeParen.numFlags.raw = (char)((ulong)uVar2 >> 0x18);
  closeParen.rawLen = (int)((ulong)uVar2 >> 0x20);
  slang::syntax::ParameterValueAssignmentSyntax::ParameterValueAssignmentSyntax
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffffa8,in_stack_ffffffffffffff98,
             in_stack_ffffffffffffff88,closeParen);
  return pPVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }